

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O1

CustomAttributeSig * __thiscall
winmd::reader::CustomAttribute::Value
          (CustomAttributeSig *__return_storage_ptr__,CustomAttribute *this)

{
  table_base *ptVar1;
  database *pdVar2;
  uint uVar3;
  byte_view cursor;
  undefined1 local_100 [32];
  void *local_e0;
  uint8_t *local_d0;
  _Optional_payload_base<winmd::reader::TypeSig> local_c0;
  vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_> local_30;
  
  ptVar1 = (this->super_row_base<winmd::reader::CustomAttribute>).m_table;
  uVar3 = table_base::get_value<unsigned_int>
                    (ptVar1,(this->super_row_base<winmd::reader::CustomAttribute>).m_index,1);
  local_100._8_4_ = (uVar3 >> 3) - 1;
  pdVar2 = ptVar1->m_database;
  if ((uVar3 & 7) == 3) {
    local_100._0_8_ = &pdVar2->MemberRef;
    MemberRef::MethodSignature((MethodDefSig *)(local_100 + 0x10),(MemberRef *)local_100);
  }
  else {
    local_100._0_8_ = &pdVar2->MethodDef;
    MethodDef::Signature((MethodDefSig *)(local_100 + 0x10),(MethodDef *)local_100);
  }
  ptVar1 = (this->super_row_base<winmd::reader::CustomAttribute>).m_table;
  pdVar2 = ptVar1->m_database;
  table_base::get_value<unsigned_int>
            (ptVar1,(this->super_row_base<winmd::reader::CustomAttribute>).m_index,2);
  database::get_blob((database *)local_100,(uint32_t)pdVar2);
  CustomAttributeSig::CustomAttributeSig
            (__return_storage_ptr__,(this->super_row_base<winmd::reader::CustomAttribute>).m_table,
             (byte_view *)local_100,(MethodDefSig *)(local_100 + 0x10));
  std::vector<winmd::reader::ParamSig,_std::allocator<winmd::reader::ParamSig>_>::~vector(&local_30)
  ;
  if (local_c0._M_engaged == true) {
    std::_Optional_payload_base<winmd::reader::TypeSig>::_M_destroy(&local_c0);
  }
  if (local_e0 != (void *)0x0) {
    operator_delete(local_e0,(long)local_d0 - (long)local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto CustomAttribute::Value() const
    {
        auto const ctor = Type();
        MethodDefSig const& method_sig = ctor.type() == CustomAttributeType::MemberRef ? ctor.MemberRef().MethodSignature() : ctor.MethodDef().Signature();
        auto cursor = get_blob(2);
        return CustomAttributeSig{ get_table(), cursor, method_sig };
    }